

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O2

void kernel::ApplyHash<HashWriter>
               (HashWriter *hash_obj,Txid *hash,
               map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
               *outputs)

{
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  Coin coin;
  COutPoint outpoint;
  Coin CStack_98;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  _Rb_tree_color local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (p_Var1 = (outputs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(outputs->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    local_48 = p_Var1[1]._M_color;
    local_68 = *(undefined8 *)(hash->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    uStack_60 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    local_58 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    uStack_50 = *(undefined8 *)((hash->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
    Coin::Coin(&CStack_98,(Coin *)&p_Var1[1]._M_parent);
    COutPoint::SerializationOps<HashWriter,COutPoint_const,ActionSerialize>(&local_68,hash_obj);
    ser_writedata32<HashWriter>(hash_obj,CStack_98._40_4_);
    CTxOut::SerializationOps<HashWriter,CTxOut_const,ActionSerialize>(&CStack_98,hash_obj);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&CStack_98.out.scriptPubKey.super_CScriptBase);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ApplyHash(T& hash_obj, const Txid& hash, const std::map<uint32_t, Coin>& outputs)
{
    for (auto it = outputs.begin(); it != outputs.end(); ++it) {
        COutPoint outpoint = COutPoint(hash, it->first);
        Coin coin = it->second;
        ApplyCoinHash(hash_obj, outpoint, coin);
    }
}